

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::PrepareCommandPool
          (DeviceContextVkImpl *this,SoftwareQueueIndex CommandQueueId)

{
  VulkanPhysicalDevice *pVVar1;
  unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  *puVar2;
  long lVar3;
  element_type *__p;
  COMMAND_QUEUE_TYPE CVar4;
  uint Value;
  ICommandQueueVk *pIVar5;
  _Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false> _Var6;
  RenderDeviceVkImpl *this_00;
  __uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  *this_01;
  ulong uVar7;
  long lVar8;
  HardwareQueueIndex QueueFamilyIndex;
  string msg;
  shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> local_38;
  
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  if ((this_00->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CmdQueueCount <= (ulong)CommandQueueId.m_Value) {
    FormatString<char[31]>(&msg,(char (*) [31])"CommandQueueId is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)&msg);
    this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  }
  pIVar5 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this_00->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  Value = (*(pIVar5->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar5);
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)&QueueFamilyIndex,Value
            );
  pVVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
           m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  uVar7 = (ulong)QueueFamilyIndex.m_Value;
  if ((ulong)(((long)(pVVar1->m_QueueFamilyProperties).
                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pVVar1->m_QueueFamilyProperties).
                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                        ._M_impl) / 0x18) <= uVar7) {
    FormatString<char[33]>(&msg,(char (*) [33])"QueueFamilyIndex is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb5);
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = (ulong)QueueFamilyIndex.m_Value;
  }
  puVar2 = (this->m_QueueFamilyCmdPools)._M_t.
           super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
           .
           super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
           ._M_head_impl;
  _Var6._M_head_impl =
       *(VulkanCommandBufferPool **)
        &puVar2[uVar7]._M_t.
         super___uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  ;
  if ((tuple<VulkanUtilities::VulkanCommandBufferPool_*,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
       )_Var6._M_head_impl ==
      (_Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false>)0x0) {
    std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
              ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>
                *)&msg,(__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                        *)(((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                           m_pObject)->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    local_38.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 3;
    std::
    make_unique<VulkanUtilities::VulkanCommandBufferPool,std::shared_ptr<VulkanUtilities::VulkanLogicalDevice_const>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const&,int>
              (&local_38,(IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag> *)&msg,
               (int *)&QueueFamilyIndex);
    __p = local_38.
          super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
    this_01 = (__uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
               *)(puVar2 + uVar7);
    local_38.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    std::
    __uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::reset(this_01,(pointer)__p);
    std::
    unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::~unique_ptr((unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                   *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
    _Var6._M_head_impl =
         (this_01->_M_t).
         super__Tuple_impl<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
         .super__Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false>._M_head_impl;
    uVar7 = (ulong)QueueFamilyIndex.m_Value;
  }
  this->m_CmdPool = _Var6._M_head_impl;
  lVar3 = *(long *)&(pVVar1->m_QueueFamilyProperties).
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl;
  lVar8 = uVar7 * 0x18;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId = QueueFamilyIndex.m_Value;
  CVar4 = VkQueueFlagsToCmdQueueType(*(VkQueueFlags *)(lVar3 + lVar8));
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueType = CVar4;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[0] =
       *(Uint32 *)(lVar3 + 0xc + lVar8);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[1] =
       *(Uint32 *)(lVar3 + 0x10 + lVar8);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[2] =
       *(Uint32 *)(lVar3 + 0x14 + lVar8);
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareCommandPool(SoftwareQueueIndex CommandQueueId)
{
    DEV_CHECK_ERR(CommandQueueId < m_pDevice->GetCommandQueueCount(), "CommandQueueId is out of range");

    const HardwareQueueIndex QueueFamilyIndex{m_pDevice->GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    const auto&              QueueProps = m_pDevice->GetPhysicalDevice().GetQueueProperties();
    DEV_CHECK_ERR(QueueFamilyIndex < QueueProps.size(), "QueueFamilyIndex is out of range");

    std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool>& Pool = m_QueueFamilyCmdPools[QueueFamilyIndex];
    if (!Pool)
    {
        // Command pools must be thread-safe because command buffers are returned into pools by release queues
        // potentially running in another thread
        Pool = std::make_unique<VulkanUtilities::VulkanCommandBufferPool>(
            m_pDevice->GetLogicalDevice().GetSharedPtr(),
            QueueFamilyIndex,
            VK_COMMAND_POOL_CREATE_TRANSIENT_BIT | VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);
    }
    m_CmdPool = Pool.get();

    // Set queue properties
    const VkQueueFamilyProperties& QueueInfo{QueueProps[QueueFamilyIndex]};
    m_Desc.QueueId                   = static_cast<Uint8>(QueueFamilyIndex);
    m_Desc.QueueType                 = VkQueueFlagsToCmdQueueType(QueueInfo.queueFlags);
    m_Desc.TextureCopyGranularity[0] = QueueInfo.minImageTransferGranularity.width;
    m_Desc.TextureCopyGranularity[1] = QueueInfo.minImageTransferGranularity.height;
    m_Desc.TextureCopyGranularity[2] = QueueInfo.minImageTransferGranularity.depth;
}